

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_strategies.cpp
# Opt level: O2

void __thiscall Clasp::ReduceParams::disable(ReduceParams *this)

{
  *(undefined8 *)&this->cflSched = 0;
  (this->cflSched).len = 0;
  (this->cflSched).grow = 1.5;
  *(undefined8 *)&this->growSched = 0;
  (this->growSched).len = 0;
  (this->growSched).grow = 1.5;
  this->strategy = (ReduceStrategy)((uint)this->strategy & 0xfffc07ff);
  this->fGrow = 0.0;
  this->fInit = 0.0;
  this->fMax = 0.0;
  (this->initRange).lo = 0xffffffff;
  (this->initRange).hi = 0xffffffff;
  this->maxRange = 0xffffffff;
  this->memMax = 0;
  return;
}

Assistant:

void ReduceParams::disable() {
	cflSched  = ScheduleStrategy::none();
	growSched = ScheduleStrategy::none();
	strategy.fReduce = 0;
	fGrow     = 0.0f; fInit = 0.0f; fMax = 0.0f;
	initRange = Range<uint32>(UINT32_MAX, UINT32_MAX);
	maxRange  = UINT32_MAX;
	memMax    = 0;
}